

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rc.cpp
# Opt level: O2

MPP_RET rc_frm_check_drop(RcCtx ctx,EncRcTask *task)

{
  long lVar1;
  code *UNRECOVERED_JUMPTABLE;
  MPP_RET MVar2;
  int iVar3;
  undefined8 in_RAX;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  
  uVar8 = (undefined4)((ulong)in_RAX >> 0x20);
  lVar1 = *(long *)((long)ctx + 8);
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc","enter %p\n","rc_frm_check_drop",ctx);
  }
  if ((lVar1 != 0) &&
     (UNRECOVERED_JUMPTABLE = *(code **)(lVar1 + 0x20), UNRECOVERED_JUMPTABLE != (code *)0x0)) {
    if (task != (EncRcTask *)0x0 && *ctx != 0) {
      MVar2 = (*UNRECOVERED_JUMPTABLE)(*ctx,task);
      return MVar2;
    }
  }
  iVar3 = *(int *)((long)ctx + 300);
  iVar4 = *(int *)((long)ctx + 0x128);
  iVar6 = *(int *)((long)ctx + 0x118) * iVar4;
  iVar5 = *(int *)((long)ctx + 0x124) * *(int *)((long)ctx + 0x11c);
  if (*(int *)((long)ctx + 0x11c) < 1) {
    uVar7 = CONCAT44(uVar8,0x98);
    _mpp_log_l(2,"rc","Assertion %s failed at %s:%d\n",(char *)0x0,"cfg->fps_in_denom >= 1",
               "rc_frm_check_drop",uVar7);
    uVar8 = (undefined4)((ulong)uVar7 >> 0x20);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0022ed33;
    iVar4 = *(int *)((long)ctx + 0x128);
  }
  if (iVar4 < 1) {
    uVar7 = CONCAT44(uVar8,0x99);
    _mpp_log_l(2,"rc","Assertion %s failed at %s:%d\n",(char *)0x0,"cfg->fps_out_denom >= 1",
               "rc_frm_check_drop",uVar7);
    uVar8 = (undefined4)((ulong)uVar7 >> 0x20);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0022ed33;
  }
  if (iVar6 < iVar5) {
    _mpp_log_l(2,"rc","Assertion %s failed at %s:%d\n",(char *)0x0,"rate_in >= rate_out",
               "rc_frm_check_drop",CONCAT44(uVar8,0x9a));
    if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0022ed33:
      abort();
    }
  }
  iVar4 = iVar6 - iVar5;
  if (-1 < iVar3) {
    iVar4 = iVar3;
  }
  iVar4 = iVar4 + iVar5;
  iVar3 = 0;
  if (iVar6 <= iVar4) {
    iVar3 = iVar6;
  }
  *(int *)((long)ctx + 300) = iVar4 - iVar3;
  (task->frm).val = (task->frm).val & 0xfffffffeffffffff | (ulong)(iVar4 < iVar6) << 0x20;
  if (((byte)rc_debug & 1) != 0) {
    _mpp_log_l(4,"rc","leave %p drop %d\n","rc_frm_check_drop",ctx,(ulong)(iVar4 < iVar6));
  }
  return MPP_OK;
}

Assistant:

MPP_RET rc_frm_check_drop(RcCtx ctx, EncRcTask *task)
{
    MppRcImpl *p = (MppRcImpl *)ctx;
    const RcImplApi *api = p->api;
    MPP_RET ret = MPP_OK;

    rc_dbg_func("enter %p\n", ctx);

    if (api && api->check_drop && p->ctx && task) {
        ret = api->check_drop(p->ctx, task);
        return ret;
    } else {
        RcFpsCfg *cfg = &p->fps;
        RK_S32 frm_cnt  = p->frm_cnt;
        RK_S32 rate_in  = cfg->fps_in_num * cfg->fps_out_denom;
        RK_S32 rate_out = cfg->fps_out_num * cfg->fps_in_denom;
        RK_S32 drop = 0;

        mpp_assert(cfg->fps_in_denom >= 1);
        mpp_assert(cfg->fps_out_denom >= 1);
        mpp_assert(rate_in >= rate_out);

        // frame counter is inited to (rate_in - rate_out)  to encode first frame
        if (frm_cnt < 0)
            frm_cnt = rate_in - rate_out;

        frm_cnt += rate_out;

        if (frm_cnt < rate_in)
            drop = 1;
        else
            frm_cnt -= rate_in;

        p->frm_cnt = frm_cnt;
        task->frm.drop = drop;
    }

    rc_dbg_func("leave %p drop %d\n", ctx, task->frm.drop);

    return ret;
}